

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

bool __thiscall
duckdb::BitpackingState<unsigned_long,long>::
Flush<duckdb::BitpackingCompressionState<unsigned_long,true,long>::BitpackingWriter>
          (BitpackingState<unsigned_long,_long> *this)

{
  bitpacking_width_t bVar1;
  unsigned_long uVar2;
  idx_t iVar3;
  BitpackingState<unsigned_long,_long> *in_RDI;
  BitpackingState<unsigned_long,_long> *unaff_retaddr;
  idx_t in_stack_00000010;
  bitpacking_width_t width;
  bitpacking_width_t regular_required_bitwidth;
  void *in_stack_00000018;
  bitpacking_width_t delta_required_bitwidth;
  unsigned_long frame_of_reference;
  void *in_stack_ffffffffffffffc8;
  BitpackingState<unsigned_long,_long> *in_stack_ffffffffffffffd0;
  void *count;
  undefined5 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe5;
  byte in_stack_ffffffffffffffe6;
  byte in_stack_ffffffffffffffe7;
  unsigned_long in_stack_ffffffffffffffe8;
  BitpackingState<unsigned_long,_long> *constant;
  bitpacking_width_t bVar4;
  bitpacking_width_t bVar5;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar6;
  
  if (in_RDI->compression_buffer_idx == 0) {
    bVar6 = true;
  }
  else if ((((in_RDI->all_invalid & 1U) == 0) && (in_RDI->maximum != in_RDI->minimum)) ||
          ((in_RDI->mode != AUTO && (in_RDI->mode != CONSTANT)))) {
    constant = in_RDI;
    BitpackingState<unsigned_long,_long>::CalculateFORStats(in_stack_ffffffffffffffd0);
    BitpackingState<unsigned_long,_long>::CalculateDeltaStats(unaff_retaddr);
    if ((in_RDI->can_do_delta & 1U) != 0) {
      if (((in_RDI->maximum_delta == in_RDI->minimum_delta) && (in_RDI->mode != FOR)) &&
         (in_RDI->mode != DELTA_FOR)) {
        BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteConstantDelta
                  ((long)constant,*in_RDI->compression_buffer,
                   CONCAT17(in_stack_ffffffffffffffe7,
                            CONCAT16(in_stack_ffffffffffffffe6,
                                     CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0)))
                   ,in_RDI->compression_buffer_internal,(bool *)in_stack_ffffffffffffffd0,
                   in_stack_ffffffffffffffc8);
        in_RDI->total_size = in_RDI->total_size + 0x14;
        return true;
      }
      in_stack_ffffffffffffffe7 =
           BitpackingPrimitives::MinimumBitWidth<unsigned_long,false>(0xa98f72);
      in_stack_ffffffffffffffe6 =
           BitpackingPrimitives::MinimumBitWidth<unsigned_long,false>(0xa98f89);
      bVar4 = (bitpacking_width_t)((ulong)constant >> 0x38);
      if ((in_stack_ffffffffffffffe7 < in_stack_ffffffffffffffe6) && (in_RDI->mode != FOR)) {
        BitpackingState<unsigned_long,_long>::SubtractFrameOfReference<long>
                  (in_RDI,in_RDI->delta_buffer,in_RDI->minimum_delta);
        bVar5 = (bitpacking_width_t)(in_RDI->compression_buffer_idx >> 0x38);
        count = in_RDI->data_ptr;
        BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteDeltaFor
                  (unaff_retaddr->compression_buffer_internal,
                   (bool *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),bVar4,
                   in_stack_ffffffffffffffe8,
                   CONCAT17(in_stack_ffffffffffffffe7,
                            CONCAT16(in_stack_ffffffffffffffe6,
                                     CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0)))
                   ,in_RDI->compression_buffer_internal,in_stack_00000010,in_stack_00000018);
        in_RDI->total_size = in_RDI->total_size + 8;
        uVar2 = AlignValue<unsigned_long,_8UL>(1);
        in_RDI->total_size = uVar2 + in_RDI->total_size;
        in_RDI->total_size = in_RDI->total_size + 8;
        iVar3 = BitpackingPrimitives::GetRequiredSize((idx_t)count,bVar5);
        in_RDI->total_size = iVar3 + in_RDI->total_size;
        return true;
      }
    }
    bVar4 = (bitpacking_width_t)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
    bVar5 = (bitpacking_width_t)((ulong)constant >> 0x38);
    if ((in_RDI->can_do_for & 1U) == 0) {
      bVar6 = false;
    }
    else {
      bVar1 = BitpackingPrimitives::MinimumBitWidth<unsigned_long,false>(0xa990bc);
      BitpackingState<unsigned_long,_long>::SubtractFrameOfReference<unsigned_long>
                (in_RDI,in_RDI->compression_buffer,in_RDI->minimum);
      BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteFor
                (unaff_retaddr->compression_buffer_internal,
                 (bool *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),bVar5,
                 in_stack_ffffffffffffffe8,
                 CONCAT17(in_stack_ffffffffffffffe7,
                          CONCAT16(in_stack_ffffffffffffffe6,
                                   CONCAT15(bVar1,in_stack_ffffffffffffffe0))),in_RDI);
      iVar3 = BitpackingPrimitives::GetRequiredSize((idx_t)in_stack_ffffffffffffffd0,bVar4);
      in_RDI->total_size = iVar3 + in_RDI->total_size;
      in_RDI->total_size = in_RDI->total_size + 8;
      uVar2 = AlignValue<unsigned_long,_8UL>(1);
      in_RDI->total_size = uVar2 + in_RDI->total_size;
      bVar6 = true;
    }
  }
  else {
    BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteConstant
              (CONCAT17(in_stack_ffffffffffffffe7,
                        CONCAT16(in_stack_ffffffffffffffe6,
                                 CONCAT15(in_stack_ffffffffffffffe5,in_stack_ffffffffffffffe0))),
               (idx_t)in_RDI,in_stack_ffffffffffffffd0,
               SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
    in_RDI->total_size = in_RDI->total_size + 0xc;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}